

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_h_predictor_32x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 *in_RCX;
  long in_RSI;
  ptrdiff_t in_RDI;
  __m128i left_col_8p;
  __m128i left_col;
  uint8_t *dst_00;
  __m128i *left_00;
  
  dst_00 = (uint8_t *)*in_RCX;
  left_00 = (__m128i *)in_RCX[1];
  h_prediction_32x8_1(left_00,dst_00,in_RDI);
  h_prediction_32x8_2(left_00,dst_00,in_RSI * 4 + in_RDI);
  return;
}

Assistant:

void aom_h_predictor_32x8_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  __m128i left_col, left_col_8p;
  (void)above;

  left_col = _mm_load_si128((const __m128i *)left);

  left_col_8p = _mm_unpacklo_epi8(left_col, left_col);
  h_prediction_32x8_1(&left_col_8p, dst, stride);
  dst += stride << 2;
  h_prediction_32x8_2(&left_col_8p, dst, stride);
}